

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O3

void __thiscall pool_display::test_method(pool_display *this)

{
  long lVar1;
  size_t sVar2;
  undefined1 uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  string *psVar7;
  long lVar8;
  long *plVar9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
  *this_00;
  const_iterator cVar10;
  ostream *poVar11;
  istringstream *piVar12;
  ulong uVar13;
  bool bVar14;
  string name_entity;
  string aSignalName;
  Entity *entity;
  string s_crmk;
  string sub_s_output_wgph;
  string sub_str_to_test;
  string str_to_test;
  string s_output_wgph;
  fstream the_debug_file;
  istringstream an_iss;
  output_test_stream output;
  ostringstream oss_output_wgph;
  Entity *local_a38;
  char *local_a30;
  undefined8 *local_a28;
  char **local_a20;
  shared_count *local_a18;
  undefined8 local_a10;
  shared_count asStack_a08 [2];
  long local_9f8;
  byte local_9f0;
  undefined8 local_9e8;
  shared_count sStack_9e0;
  long *local_9d8 [2];
  long local_9c8 [2];
  long *local_9b8;
  ulong local_9b0;
  long local_9a8 [2];
  char *local_998;
  char *local_990;
  long *local_988;
  size_t local_980;
  long local_978 [2];
  long *local_968 [2];
  long local_958 [2];
  long *local_948 [2];
  long local_938 [2];
  key_type local_928 [16];
  undefined **local_718;
  char *local_710;
  shared_count sStack_708;
  Entity **local_700;
  ios_base local_6a0 [264];
  shared_count *local_598;
  undefined8 local_590;
  shared_count asStack_588 [46];
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  ios_base local_138 [264];
  
  psVar7 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_928[0]._M_dataplus._M_p = (pointer)((long)local_928 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"MyEntity","");
  local_598 = asStack_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"MyEntityInst","");
  lVar8 = dynamicgraph::FactoryStorage::newEntity(psVar7,(string *)local_928);
  if (local_598 != asStack_588) {
    operator_delete(local_598,(ulong)((long)&(asStack_588[0].pi_)->_vptr_sp_counted_base + 1));
  }
  if (local_928[0]._M_dataplus._M_p != (pointer)((long)local_928 + 0x10)) {
    operator_delete(local_928[0]._M_dataplus._M_p,local_928[0].field_2._M_allocated_capacity + 1);
  }
  local_9f8 = lVar8;
  psVar7 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_928[0]._M_dataplus._M_p = (pointer)((long)local_928 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"MyEntity","");
  local_598 = asStack_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"MyEntityInst","");
  lVar8 = dynamicgraph::FactoryStorage::newEntity(psVar7,(string *)local_928);
  if (local_598 != asStack_588) {
    operator_delete(local_598,(ulong)((long)&(asStack_588[0].pi_)->_vptr_sp_counted_base + 1));
  }
  if (local_928[0]._M_dataplus._M_p != (pointer)((long)local_928 + 0x10)) {
    operator_delete(local_928[0]._M_dataplus._M_p,local_928[0].field_2._M_allocated_capacity + 1);
  }
  lVar1 = local_9f8;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x44);
  local_590 = 0;
  asStack_588[0].pi_ = (sp_counted_base *)0x0;
  local_928[0].field_2._8_8_ = &local_718;
  local_718 = (undefined **)0x11f208;
  local_710 = "";
  local_928[0]._M_string_length._0_1_ = 0;
  local_928[0]._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127cb0;
  local_928[0].field_2._M_allocated_capacity = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_1d0 = "";
  local_598._0_1_ = (string)(lVar8 == lVar1);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_588);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x48);
  local_598 = (shared_count *)((ulong)local_598._1_7_ << 8);
  local_590 = 0;
  asStack_588[0].pi_ = (sp_counted_base *)0x0;
  local_718 = (undefined **)0x11f20d;
  local_710 = "";
  local_928[0]._M_string_length._0_1_ = 0;
  local_928[0]._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127cb0;
  local_928[0].field_2._M_allocated_capacity = &boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_200 = "";
  local_928[0].field_2._8_8_ = &local_718;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_588);
  psVar7 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_928[0]._M_dataplus._M_p = (pointer)((long)local_928 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"MyEntityInstFailure","");
  dynamicgraph::FactoryStorage::deregisterEntity(psVar7);
  if (local_928[0]._M_dataplus._M_p != (pointer)((long)local_928 + 0x10)) {
    operator_delete(local_928[0]._M_dataplus._M_p,local_928[0].field_2._M_allocated_capacity + 1);
  }
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x51);
  local_598 = (shared_count *)((ulong)local_598 & 0xffffffffffffff00);
  local_590 = 0;
  asStack_588[0].pi_ = (sp_counted_base *)0x0;
  local_718 = (undefined **)0x11f20d;
  local_710 = "";
  local_928[0]._M_string_length._0_1_ = 0;
  local_928[0]._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127cb0;
  local_928[0].field_2._M_allocated_capacity = &boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_230 = "";
  local_928[0].field_2._8_8_ = &local_718;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_588);
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream
            ((output_test_stream *)&local_598,&local_248,1,1);
  psVar7 = (string *)dynamicgraph::PoolStorage::getInstance();
  local_928[0]._M_dataplus._M_p = (pointer)((long)local_928 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"MyEntityInst","");
  plVar9 = (long *)dynamicgraph::PoolStorage::getEntity(psVar7);
  if (local_928[0]._M_dataplus._M_p != (pointer)((long)local_928 + 0x10)) {
    operator_delete(local_928[0]._M_dataplus._M_p,local_928[0].field_2._M_allocated_capacity + 1);
  }
  (**(code **)(*plVar9 + 0x30))(plVar9,&local_598);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x57);
  local_278 = "Hello! My name is MyEntityInst !\n";
  local_270 = "";
  boost::test_tools::output_test_stream::is_equal(&local_718,&local_598,&local_278,1);
  local_1a8 = "output.is_equal(\"Hello! My name is MyEntityInst !\\n\")";
  local_1a0 = "";
  local_928[0]._M_string_length._0_1_ = 0;
  local_928[0]._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127cb0;
  local_928[0].field_2._M_allocated_capacity = &boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_280 = "";
  local_928[0].field_2._8_8_ = &local_1a8;
  boost::test_tools::tt_detail::report_assertion(&local_718,local_928,&local_288,0x57,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_708);
  psVar7 = (string *)dynamicgraph::PoolStorage::getInstance();
  local_928[0]._M_dataplus._M_p = (pointer)((long)local_928 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"MyEntityInstFailure","");
  dynamicgraph::PoolStorage::getEntity(psVar7);
  if (local_928[0]._M_dataplus._M_p != (pointer)((long)local_928 + 0x10)) {
    operator_delete(local_928[0]._M_dataplus._M_p,local_928[0].field_2._M_allocated_capacity + 1);
  }
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x60);
  local_718 = (undefined **)((ulong)local_718 & 0xffffffffffffff00);
  local_710 = (char *)0x0;
  sStack_708.pi_ = (sp_counted_base *)0x0;
  local_1a8 = "res";
  local_1a0 = "";
  local_928[0]._M_string_length._0_1_ = 0;
  local_928[0]._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127cb0;
  local_928[0].field_2._M_allocated_capacity = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_2b0 = "";
  local_928[0].field_2._8_8_ = &local_1a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_708);
  dynamicgraph::PoolStorage::getInstance();
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
             *)dynamicgraph::PoolStorage::getEntityMap_abi_cxx11_();
  local_928[0]._M_dataplus._M_p = (pointer)((long)local_928 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"MyEntityInst","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
           ::find(this_00,local_928);
  if (local_928[0]._M_dataplus._M_p != (pointer)((long)local_928 + 0x10)) {
    operator_delete(local_928[0]._M_dataplus._M_p,local_928[0].field_2._M_allocated_capacity + 1);
  }
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c8,0x67);
  local_718 = (undefined **)CONCAT71(local_718._1_7_,cVar10._M_node != (_Base_ptr)(this_00 + 8));
  local_710 = (char *)0x0;
  sStack_708.pi_ = (sp_counted_base *)0x0;
  local_1a8 = "!testExistence";
  local_1a0 = "";
  local_928[0]._M_string_length._0_1_ = 0;
  local_928[0]._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127cb0;
  local_928[0].field_2._M_allocated_capacity = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_2e0 = "";
  local_928[0].field_2._8_8_ = &local_1a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_708);
  psVar7 = (string *)dynamicgraph::PoolStorage::getInstance();
  local_928[0]._M_dataplus._M_p = (pointer)((long)local_928 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"MyEntityInst","");
  uVar3 = dynamicgraph::PoolStorage::existEntity(psVar7,(Entity **)local_928);
  if (local_928[0]._M_dataplus._M_p != (pointer)((long)local_928 + 0x10)) {
    operator_delete(local_928[0]._M_dataplus._M_p,local_928[0].field_2._M_allocated_capacity + 1);
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x6d);
  local_718 = (undefined **)CONCAT71(local_718._1_7_,uVar3);
  local_710 = (char *)0x0;
  sStack_708.pi_ = (sp_counted_base *)0x0;
  local_1a8 = "testExistence";
  local_1a0 = "";
  local_928[0]._M_string_length._0_1_ = 0;
  local_928[0]._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127cb0;
  local_928[0].field_2._M_allocated_capacity = &boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_310 = "";
  local_928[0].field_2._8_8_ = &local_1a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_708);
  poVar11 = (ostream *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::writeCompletionList(poVar11);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x73);
  local_348 = "MyEntityInst.in_double\nMyEntityInst.out_double\nprint\nsignals\nsignalDep\n";
  local_340 = "";
  boost::test_tools::output_test_stream::is_equal(&local_718,&local_598,&local_348,1);
  local_1a8 = 
  "output.is_equal(\"MyEntityInst.in_double\\nMyEntityInst.out_double\\n\" \"print\\nsignals\\nsignalDep\\n\")"
  ;
  local_1a0 = "";
  local_928[0]._M_string_length._0_1_ = 0;
  local_928[0]._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127cb0;
  local_928[0].field_2._M_allocated_capacity = &boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_350 = "";
  local_928[0].field_2._8_8_ = &local_1a8;
  boost::test_tools::tt_detail::report_assertion(&local_718,local_928,&local_358,0x73,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_708);
  psVar7 = (string *)dynamicgraph::PoolStorage::getInstance();
  local_928[0]._M_dataplus._M_p = (pointer)((long)local_928 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"output.dot","");
  dynamicgraph::PoolStorage::writeGraph(psVar7);
  if (local_928[0]._M_dataplus._M_p != (pointer)((long)local_928 + 0x10)) {
    operator_delete(local_928[0]._M_dataplus._M_p,local_928[0].field_2._M_allocated_capacity + 1);
  }
  std::fstream::fstream(local_928);
  std::fstream::open((char *)local_928,0x11f337);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::ostream::operator<<(&local_1a8,(streambuf *)((long)local_928 + 0x18));
  std::fstream::close();
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_968,
             "/* This graph has been automatically generated.\n   2019 Month: 2 Day: 28 Time: 11:28 */\ndigraph \"output\" { \t graph [ label=\"output\" bgcolor = white rankdir=LR ]\n\t node [ fontcolor = black, color = black,fillcolor = gold1, style=filled, shape=box ] ; \n\tsubgraph cluster_Entities { \n\t} \n\"MyEntityInst\" [ label = \"MyEntityInst\" ,\n   fontcolor = black, color = black, fillcolor=cyan, style=filled, shape=box ]\n}\n"
             ,"");
  std::__cxx11::stringbuf::str();
  local_9d8[0] = local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"*/","");
  std::__cxx11::string::find((char *)local_948,(ulong)local_9d8[0],0);
  std::__cxx11::string::substr((ulong)&local_9b8,(ulong)local_948);
  std::__cxx11::string::find((char *)local_968,(ulong)local_9d8[0],0);
  std::__cxx11::string::substr((ulong)&local_988,(ulong)local_968);
  sVar2 = local_980;
  plVar9 = local_988;
  if (local_980 == local_9b0) {
    if (local_980 == 0) {
      bVar14 = true;
    }
    else {
      iVar5 = bcmp(local_988,local_9b8,local_980);
      bVar14 = iVar5 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)plVar9,sVar2);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_9b8,local_9b0);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  uVar13 = local_980;
  if (local_9b0 < local_980) {
    uVar13 = local_9b0;
  }
  if (uVar13 != 0) {
    uVar6 = memcmp(local_988,local_9b8,uVar13);
    uVar13 = (ulong)uVar6;
    if (uVar6 != 0) goto LAB_00113e38;
  }
  uVar13 = 0xffffffff80000000;
  if (-0x80000000 < (long)(local_980 - local_9b0)) {
    uVar13 = local_980 - local_9b0;
  }
  if (0x7ffffffe < (long)uVar13) {
    uVar13 = 0x7fffffff;
  }
LAB_00113e38:
  plVar9 = (long *)std::ostream::operator<<(&std::cout,(int)uVar13);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_368,0x9c);
  local_a18 = (shared_count *)CONCAT71(local_a18._1_7_,bVar14);
  local_a10 = 0;
  asStack_a08[0].pi_ = (sp_counted_base *)0x0;
  local_700 = &local_a38;
  local_a38 = (Entity *)0x11f4de;
  local_a30 = "";
  local_710 = (char *)((ulong)local_710 & 0xffffffffffffff00);
  local_718 = &PTR__lazy_ostream_00127cb0;
  sStack_708.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_380 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_a08);
  local_a18 = asStack_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"MyEntityInst.in_double","");
  std::__cxx11::istringstream::istringstream((istringstream *)&local_718,(string *)&local_a18,_S_in)
  ;
  if (local_a18 != asStack_a08) {
    operator_delete(local_a18,(ulong)((long)&(asStack_a08[0].pi_)->_vptr_sp_counted_base + 1));
  }
  piVar12 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  lVar8 = dynamicgraph::PoolStorage::getSignal(piVar12);
  local_a18 = asStack_a08;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a18,*(long *)(lVar8 + 8),
             *(long *)(lVar8 + 0x10) + *(long *)(lVar8 + 8));
  iVar5 = std::__cxx11::string::compare((char *)&local_a18);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_398,0xa7);
  local_9f0 = iVar5 == 0;
  local_9e8 = 0;
  sStack_9e0.pi_ = (sp_counted_base *)0x0;
  local_998 = "testExistence";
  local_990 = "";
  local_a30 = (char *)((ulong)local_a30 & 0xffffffffffffff00);
  local_a38 = (Entity *)&PTR__lazy_ostream_00127cb0;
  local_a28 = &boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_3b0 = "";
  local_a20 = &local_998;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_9e0);
  local_a38 = (Entity *)&local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a38,"MyEntityInst.in2double","");
  std::__cxx11::stringbuf::str((string *)&sStack_708);
  if (local_a38 != (Entity *)&local_a28) {
    operator_delete(local_a38,(long)local_a28 + 1);
  }
  piVar12 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::getSignal(piVar12);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c8,0xb1);
  local_9f0 = 0;
  local_9e8 = 0;
  sStack_9e0.pi_ = (sp_counted_base *)0x0;
  local_998 = "res";
  local_990 = "";
  local_a30 = (char *)((ulong)local_a30 & 0xffffffffffffff00);
  local_a38 = (Entity *)&PTR__lazy_ostream_00127cb0;
  local_a28 = &boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_3e0 = "";
  local_a20 = &local_998;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_9e0);
  psVar7 = (string *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::deregisterEntity(psVar7);
  psVar7 = (string *)dynamicgraph::PoolStorage::getInstance();
  local_a38 = (Entity *)&local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a38,"MyEntityInst","");
  bVar4 = dynamicgraph::PoolStorage::existEntity(psVar7,&local_a38);
  if (local_a38 != (Entity *)&local_a28) {
    operator_delete(local_a38,(long)local_a28 + 1);
  }
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3f8,0xba);
  local_9f0 = bVar4 ^ 1;
  local_9e8 = 0;
  sStack_9e0.pi_ = (sp_counted_base *)0x0;
  local_998 = "!testExistence";
  local_990 = "";
  local_a30 = (char *)((ulong)local_a30 & 0xffffffffffffff00);
  local_a38 = (Entity *)&PTR__lazy_ostream_00127cb0;
  local_a28 = &boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/pool.cpp";
  local_410 = "";
  local_a20 = &local_998;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_9e0);
  local_a38 = (Entity *)&local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a38,"MyEntityInst2","");
  psVar7 = (string *)dynamicgraph::PoolStorage::getInstance();
  dynamicgraph::PoolStorage::clearPlugin(psVar7);
  dynamicgraph::PoolStorage::destroy();
  if (local_a38 != (Entity *)&local_a28) {
    operator_delete(local_a38,(long)local_a28 + 1);
  }
  if (local_a18 != asStack_a08) {
    operator_delete(local_a18,(ulong)((long)&(asStack_a08[0].pi_)->_vptr_sp_counted_base + 1));
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_718);
  std::ios_base::~ios_base(local_6a0);
  if (local_988 != local_978) {
    operator_delete(local_988,local_978[0] + 1);
  }
  if (local_9b8 != local_9a8) {
    operator_delete(local_9b8,local_9a8[0] + 1);
  }
  if (local_9d8[0] != local_9c8) {
    operator_delete(local_9d8[0],local_9c8[0] + 1);
  }
  if (local_948[0] != local_938) {
    operator_delete(local_948[0],local_938[0] + 1);
  }
  if (local_968[0] != local_958) {
    operator_delete(local_968[0],local_958[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  std::fstream::~fstream(local_928);
  boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)&local_598);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(pool_display) {
  /// Create Entity
  dg::Entity *entity =
      dg::FactoryStorage::getInstance()->newEntity("MyEntity", "MyEntityInst");

  /// Test exception catching when registering Entity
  bool res = false;
  try {
    dg::Entity *entity2 = dg::FactoryStorage::getInstance()->newEntity(
        "MyEntity", "MyEntityInst");

    bool res2 = (entity2 == entity);
    BOOST_CHECK(res2);
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::OBJECT_CONFLICT);
  }
  BOOST_CHECK(res);

  /// Test exception catching when deregistering Entity
  res = false;
  try {
    dg::FactoryStorage::getInstance()->deregisterEntity("MyEntityInstFailure");
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::OBJECT_CONFLICT);
  }
  BOOST_CHECK(res);

  /// Search for an entity inside the map
  output_test_stream output;
  dg::Entity &e = dg::PoolStorage::getInstance()->getEntity("MyEntityInst");
  e.display(output);
  BOOST_CHECK(output.is_equal("Hello! My name is MyEntityInst !\n"));

  /// Search for an entity inside the map
  res = false;
  try {
    dg::PoolStorage::getInstance()->getEntity("MyEntityInstFailure");
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::UNREFERED_OBJECT);
  }
  BOOST_CHECK(res);

  /// Testing entityMap
  const dg::PoolStorage::Entities &anEntityMap =
      dg::PoolStorage::getInstance()->getEntityMap();

  bool testExistence = anEntityMap.find("MyEntityInst") == anEntityMap.end();
  BOOST_CHECK(!testExistence);

  /// Testing the existence of an entity
  testExistence =
      dg::PoolStorage::getInstance()->existEntity("MyEntityInst", entity);

  BOOST_CHECK(testExistence);

  /// Testing the completion list of pool storage
  dg::PoolStorage::getInstance()->writeCompletionList(output);
  BOOST_CHECK(
      output.is_equal("MyEntityInst.in_double\nMyEntityInst.out_double\n"
                      "print\nsignals\nsignalDep\n"));

  /// Checking the graph generated by the pool
  dg::PoolStorage::getInstance()->writeGraph("output.dot");
  std::fstream the_debug_file;
  the_debug_file.open("output.dot");
  std::ostringstream oss_output_wgph;
  oss_output_wgph << the_debug_file.rdbuf();
  the_debug_file.close();

  /// Use a predefined output
  std::string str_to_test =
      "/* This graph has been automatically generated.\n"
      "   2019 Month: 2 Day: 28 Time: 11:28 */\n"
      "digraph \"output\" { \t graph [ label=\"output\" "
      "bgcolor = white rankdir=LR ]\n"
      "\t node [ fontcolor = black, color = black,fillcolor = gold1,"
      " style=filled, shape=box ] ; \n"
      "\tsubgraph cluster_Entities { \n"
      "\t} \n"
      "\"MyEntityInst\" [ label = \"MyEntityInst\" ,\n"
      "   fontcolor = black, color = black, fillcolor=cyan, style=filled,"
      " shape=box ]\n"
      "}\n";

  /// Check the two substring (remove the date) -
  std::string s_output_wgph = oss_output_wgph.str();
  std::string s_crmk = "*/";

  std::size_t find_s_output_wgph = s_output_wgph.find(s_crmk);
  std::string sub_s_output_wgph =
      s_output_wgph.substr(find_s_output_wgph, s_output_wgph.length());
  std::size_t find_str_to_test = str_to_test.find(s_crmk);
  std::string sub_str_to_test =
      str_to_test.substr(find_str_to_test, str_to_test.length());

  bool two_sub_string_identical;
  two_sub_string_identical = sub_str_to_test == sub_s_output_wgph;
  std::cout << sub_str_to_test << std::endl;
  std::cout << sub_s_output_wgph << std::endl;
  std::cout << sub_str_to_test.compare(sub_s_output_wgph) << std::endl;
  BOOST_CHECK(two_sub_string_identical);

  /// Test name of a valid signal.
  std::istringstream an_iss("MyEntityInst.in_double");

  dg::SignalBase<int> &aSignal =
      dg::PoolStorage::getInstance()->getSignal(an_iss);

  std::string aSignalName = aSignal.getName();
  testExistence =
      aSignalName == "MyEntity(MyEntityInst)::input(double)::in_double";
  BOOST_CHECK(testExistence);

  /// Test name of an unvalid signal.
  an_iss.str("MyEntityInst.in2double");

  try {
    dg::PoolStorage::getInstance()->getSignal(an_iss);
  } catch (const dg::ExceptionFactory &aef) {
    res = (aef.getCode() == dg::ExceptionFactory::UNREFERED_SIGNAL);
  }
  BOOST_CHECK(res);

  /// Deregister the entity.
  dg::PoolStorage::getInstance()->deregisterEntity(entity->getName());

  /// Testing the existance of an entity
  testExistence =
      dg::PoolStorage::getInstance()->existEntity("MyEntityInst", entity);

  BOOST_CHECK(!testExistence);

  /// Create Entity
  std::string name_entity("MyEntityInst2");
  dg::PoolStorage::getInstance()->clearPlugin(name_entity);

  dg::PoolStorage::destroy();
}